

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O0

matches * find_best_matches(matches *__return_storage_ptr__,image_descriptors *descriptors,
                           CSD *base_descriptor)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  pair<float,_std::filesystem::__cxx11::path> local_e0;
  float local_ac;
  undefined1 local_a8 [4];
  float index;
  float local_64;
  type *ptStack_60;
  float similarity_index;
  type *descriptor;
  type *p;
  __normal_iterator<const_std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_*,_std::vector<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>_>
  local_48;
  const_iterator __end1;
  const_iterator __begin1;
  image_descriptors *__range1;
  size_t matches_num;
  CSD *base_descriptor_local;
  image_descriptors *descriptors_local;
  matches *matches;
  
  std::
  priority_queue<std::pair<float,std::filesystem::__cxx11::path>,std::vector<std::pair<float,std::filesystem::__cxx11::path>,std::allocator<std::pair<float,std::filesystem::__cxx11::path>>>,similarity_pair_less>
  ::
  priority_queue<std::vector<std::pair<float,std::filesystem::__cxx11::path>,std::allocator<std::pair<float,std::filesystem::__cxx11::path>>>,void>
            ((priority_queue<std::pair<float,std::filesystem::__cxx11::path>,std::vector<std::pair<float,std::filesystem::__cxx11::path>,std::allocator<std::pair<float,std::filesystem::__cxx11::path>>>,similarity_pair_less>
              *)__return_storage_ptr__);
  if (app.matches_num == -1) {
    sVar2 = CLI::std::
            vector<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>
            ::size(descriptors);
    app.matches_num = (int)sVar2;
  }
  uVar3 = (ulong)app.matches_num;
  __end1 = CLI::std::
           vector<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>
           ::begin(descriptors);
  local_48._M_current =
       (pair<std::filesystem::__cxx11::path,_image_match::CSD> *)
       CLI::std::
       vector<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>
       ::end(descriptors);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_48), bVar1) {
    p = &__gnu_cxx::
         __normal_iterator<const_std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_*,_std::vector<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>_>
         ::operator*(&__end1)->first;
    descriptor = (type *)std::get<0ul,std::filesystem::__cxx11::path,image_match::CSD>
                                   ((pair<std::filesystem::__cxx11::path,_image_match::CSD> *)p);
    ptStack_60 = std::get<1ul,std::filesystem::__cxx11::path,image_match::CSD>
                           ((pair<std::filesystem::__cxx11::path,_image_match::CSD> *)p);
    local_64 = image_match::compare(base_descriptor,ptStack_60);
    sVar4 = CLI::std::
            priority_queue<std::pair<float,_std::filesystem::__cxx11::path>,_std::vector<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>,_similarity_pair_less>
            ::size(__return_storage_ptr__);
    if (sVar4 < uVar3) {
      CLI::std::pair<float,_std::filesystem::__cxx11::path>::pair<float_&,_true>
                ((pair<float,_std::filesystem::__cxx11::path> *)local_a8,&local_64,
                 (path *)descriptor);
      CLI::std::
      priority_queue<std::pair<float,_std::filesystem::__cxx11::path>,_std::vector<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>,_similarity_pair_less>
      ::push(__return_storage_ptr__,(value_type *)local_a8);
      CLI::std::pair<float,_std::filesystem::__cxx11::path>::~pair
                ((pair<float,_std::filesystem::__cxx11::path> *)local_a8);
    }
    else {
      pvVar5 = CLI::std::
               priority_queue<std::pair<float,_std::filesystem::__cxx11::path>,_std::vector<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>,_similarity_pair_less>
               ::top(__return_storage_ptr__);
      local_ac = pvVar5->first;
      if (local_64 < local_ac) {
        CLI::std::
        priority_queue<std::pair<float,_std::filesystem::__cxx11::path>,_std::vector<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>,_similarity_pair_less>
        ::pop(__return_storage_ptr__);
        CLI::std::pair<float,_std::filesystem::__cxx11::path>::pair<float_&,_true>
                  (&local_e0,&local_64,(path *)descriptor);
        CLI::std::
        priority_queue<std::pair<float,_std::filesystem::__cxx11::path>,_std::vector<std::pair<float,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<float,_std::filesystem::__cxx11::path>_>_>,_similarity_pair_less>
        ::push(__return_storage_ptr__,&local_e0);
        CLI::std::pair<float,_std::filesystem::__cxx11::path>::~pair(&local_e0);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_*,_std::vector<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>,_std::allocator<std::pair<std::filesystem::__cxx11::path,_image_match::CSD>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

matches
find_best_matches(const image_descriptors& descriptors,
                  const image_match::CSD& base_descriptor)
{
    matches matches;

    if (app.matches_num == -1)
        app.matches_num = descriptors.size();

    size_t matches_num = app.matches_num;
    for (auto&& [p, descriptor] : descriptors) {
        auto similarity_index =
          image_match::compare(base_descriptor, descriptor);

        if (matches.size() < matches_num) {
            matches.push({ similarity_index, p });
        } else {
            auto index = matches.top().first;
            if (similarity_index < index) {
                matches.pop();
                matches.push({ similarity_index, p });
            }
        }
    }

    return matches;
}